

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

int __thiscall
QListModeViewBase::verticalScrollToValue
          (QListModeViewBase *this,int index,ScrollHint hint,bool above,bool below,QRect *area,
          QRect *rect)

{
  ulong uVar1;
  ScrollMode SVar2;
  int iVar3;
  int iVar4;
  P _b;
  QScrollBar *pQVar5;
  long lVar6;
  long lVar7;
  ScrollHint hint_00;
  Data *pDVar8;
  ulong uVar9;
  int iVar10;
  
  iVar3 = index;
  SVar2 = QAbstractItemView::verticalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  if (SVar2 != ScrollPerItem) {
    iVar3 = QCommonListViewBase::verticalScrollToValue
                      (&this->super_QCommonListViewBase,iVar3,hint,above,below,area,rect);
    return iVar3;
  }
  if ((this->scrollValueMap).d.size == 0) {
    iVar3 = 0;
    goto LAB_0057ba46;
  }
  pQVar5 = QAbstractScrollArea::verticalScrollBar
                     ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
  iVar3 = QAbstractSlider::value(&pQVar5->super_QAbstractSlider);
  pDVar8 = (((this->super_QCommonListViewBase).dd)->hiddenRows).q_hash.d;
  iVar10 = 0;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
LAB_0057b95d:
    uVar9 = 0;
  }
  else {
    if (pDVar8->spans->offsets[0] != 0xff) goto LAB_0057b95d;
    uVar1 = 1;
    do {
      uVar9 = uVar1;
      if (pDVar8->numBuckets == uVar9) {
        pDVar8 = (Data *)0x0;
        uVar9 = 0;
        break;
      }
      uVar1 = uVar9 + 1;
    } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
  }
  if ((uVar9 != 0) || (pDVar8 != (Data *)0x0)) {
    iVar10 = 0;
    do {
      iVar4 = QPersistentModelIndex::row();
      iVar10 = (uint)(iVar4 <= iVar3) + iVar10;
      do {
        if (pDVar8->numBuckets - 1 == uVar9) {
          uVar9 = 0;
          pDVar8 = (Data *)0x0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((uVar9 != 0) || (pDVar8 != (Data *)0x0));
  }
  pQVar5 = QAbstractScrollArea::verticalScrollBar
                     ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
  iVar3 = QAbstractSlider::value(&pQVar5->super_QAbstractSlider);
  lVar6 = (long)(this->scrollValueMap).d.ptr[iVar3] - (long)iVar10;
  lVar7 = (this->flowPositions).d.size + -1;
  if (lVar6 <= lVar7) {
    lVar7 = lVar6;
  }
  lVar6 = 0;
  if (0 < lVar7) {
    lVar6 = lVar7;
  }
  iVar3 = (int)lVar6;
LAB_0057ba46:
  if (below) {
    hint = PositionAtBottom;
  }
  hint_00 = PositionAtTop;
  if (!above) {
    hint_00 = hint;
  }
  if (hint_00 != EnsureVisible) {
    iVar3 = perItemScrollToValue
                      (this,index,iVar3,((area->y2).m_i - (area->y1).m_i) + 1,hint_00,Vertical,
                       ((this->super_QCommonListViewBase).dd)->wrap,
                       ((rect->y2).m_i - (rect->y1).m_i) + 1);
  }
  return iVar3;
}

Assistant:

int QListModeViewBase::verticalScrollToValue(int index, QListView::ScrollHint hint,
                                          bool above, bool below, const QRect &area, const QRect &rect) const
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int value;
        if (scrollValueMap.isEmpty()) {
            value = 0;
        } else {
            int scrollBarValue = verticalScrollBar()->value();
            int numHidden = 0;
            for (const auto &idx : std::as_const(dd->hiddenRows))
                if (idx.row() <= scrollBarValue)
                    ++numHidden;
            value = qBound(0, scrollValueMap.at(verticalScrollBar()->value()) - numHidden, flowPositions.size() - 1);
        }
        if (above)
            hint = QListView::PositionAtTop;
        else if (below)
            hint = QListView::PositionAtBottom;
        if (hint == QListView::EnsureVisible)
            return value;

        return perItemScrollToValue(index, value, area.height(), hint, Qt::Vertical, isWrapping(), rect.height());
    }

    return QCommonListViewBase::verticalScrollToValue(index, hint, above, below, area, rect);
}